

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_rand_bytes(void *data_,size_t len)

{
  uint uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t tmp;
  uint64_t t3;
  uint64_t t2;
  uint64_t t1;
  uint64_t t0;
  size_t i;
  uint8_t *data;
  size_t len_local;
  void *data__local;
  
  if (data_ == (void *)0x0) {
    return;
  }
  if (len == 0) {
    return;
  }
  i = (size_t)data_;
  for (t0 = len >> 5; t0 != 0; t0 = t0 - 1) {
    uVar2 = fio_rand64();
    uVar3 = fio_rand64();
    uVar4 = fio_rand64();
    uVar5 = fio_rand64();
    *(char *)i = (char)(uVar2 >> 0x38);
    *(char *)(i + 1) = (char)(uVar2 >> 0x30);
    *(char *)(i + 2) = (char)(uVar2 >> 0x28);
    *(char *)(i + 3) = (char)(uVar2 >> 0x20);
    *(char *)(i + 4) = (char)(uVar2 >> 0x18);
    *(char *)(i + 5) = (char)(uVar2 >> 0x10);
    *(char *)(i + 6) = (char)(uVar2 >> 8);
    *(char *)(i + 7) = (char)uVar2;
    *(char *)(i + 8) = (char)(uVar3 >> 0x38);
    *(char *)(i + 9) = (char)(uVar3 >> 0x30);
    *(char *)(i + 10) = (char)(uVar3 >> 0x28);
    *(char *)(i + 0xb) = (char)(uVar3 >> 0x20);
    *(char *)(i + 0xc) = (char)(uVar3 >> 0x18);
    *(char *)(i + 0xd) = (char)(uVar3 >> 0x10);
    *(char *)(i + 0xe) = (char)(uVar3 >> 8);
    *(char *)(i + 0xf) = (char)uVar3;
    *(char *)(i + 0x10) = (char)(uVar4 >> 0x38);
    *(char *)(i + 0x11) = (char)(uVar4 >> 0x30);
    *(char *)(i + 0x12) = (char)(uVar4 >> 0x28);
    *(char *)(i + 0x13) = (char)(uVar4 >> 0x20);
    *(char *)(i + 0x14) = (char)(uVar4 >> 0x18);
    *(char *)(i + 0x15) = (char)(uVar4 >> 0x10);
    *(char *)(i + 0x16) = (char)(uVar4 >> 8);
    *(char *)(i + 0x17) = (char)uVar4;
    *(char *)(i + 0x18) = (char)(uVar5 >> 0x38);
    *(char *)(i + 0x19) = (char)(uVar5 >> 0x30);
    *(char *)(i + 0x1a) = (char)(uVar5 >> 0x28);
    *(char *)(i + 0x1b) = (char)(uVar5 >> 0x20);
    *(char *)(i + 0x1c) = (char)(uVar5 >> 0x18);
    *(char *)(i + 0x1d) = (char)(uVar5 >> 0x10);
    *(char *)(i + 0x1e) = (char)(uVar5 >> 8);
    *(char *)(i + 0x1f) = (char)uVar5;
    i = i + 0x20;
  }
  uVar1 = (uint)len & 0x18;
  if (uVar1 != 8) {
    if (uVar1 != 0x10) {
      if (uVar1 != 0x18) goto LAB_00148d39;
      uVar2 = fio_rand64();
      *(char *)(i + 0x10) = (char)(uVar2 >> 0x38);
      *(char *)(i + 0x11) = (char)(uVar2 >> 0x30);
      *(char *)(i + 0x12) = (char)(uVar2 >> 0x28);
      *(char *)(i + 0x13) = (char)(uVar2 >> 0x20);
      *(char *)(i + 0x14) = (char)(uVar2 >> 0x18);
      *(char *)(i + 0x15) = (char)(uVar2 >> 0x10);
      *(char *)(i + 0x16) = (char)(uVar2 >> 8);
      *(char *)(i + 0x17) = (char)uVar2;
    }
    uVar2 = fio_rand64();
    *(char *)(i + 8) = (char)(uVar2 >> 0x38);
    *(char *)(i + 9) = (char)(uVar2 >> 0x30);
    *(char *)(i + 10) = (char)(uVar2 >> 0x28);
    *(char *)(i + 0xb) = (char)(uVar2 >> 0x20);
    *(char *)(i + 0xc) = (char)(uVar2 >> 0x18);
    *(char *)(i + 0xd) = (char)(uVar2 >> 0x10);
    *(char *)(i + 0xe) = (char)(uVar2 >> 8);
    *(char *)(i + 0xf) = (char)uVar2;
  }
  uVar2 = fio_rand64();
  *(char *)i = (char)(uVar2 >> 0x38);
  *(char *)(i + 1) = (char)(uVar2 >> 0x30);
  *(char *)(i + 2) = (char)(uVar2 >> 0x28);
  *(char *)(i + 3) = (char)(uVar2 >> 0x20);
  *(char *)(i + 4) = (char)(uVar2 >> 0x18);
  *(char *)(i + 5) = (char)(uVar2 >> 0x10);
  *(char *)(i + 6) = (char)(uVar2 >> 8);
  *(char *)(i + 7) = (char)uVar2;
  i = (len & 0x18) + i;
LAB_00148d39:
  if ((len & 7) != 0) {
    uVar2 = fio_rand64();
    switch((uint)len & 7) {
    case 7:
      *(char *)(i + 6) = (char)(uVar2 >> 8);
    case 6:
      *(char *)(i + 5) = (char)(uVar2 >> 0x10);
    case 5:
      *(char *)(i + 4) = (char)(uVar2 >> 0x18);
    case 4:
      *(char *)(i + 3) = (char)(uVar2 >> 0x20);
    case 3:
      *(char *)(i + 2) = (char)(uVar2 >> 0x28);
    case 2:
      *(char *)(i + 1) = (char)(uVar2 >> 0x30);
    case 1:
      *(char *)i = (char)(uVar2 >> 0x38);
    }
  }
  return;
}

Assistant:

void fio_rand_bytes(void *data_, size_t len) {
  if (!data_ || !len)
    return;
  uint8_t *data = data_;
  /* unroll 32 bytes / 256 bit writes */
  for (size_t i = (len >> 5); i; --i) {
    const uint64_t t0 = fio_rand64();
    const uint64_t t1 = fio_rand64();
    const uint64_t t2 = fio_rand64();
    const uint64_t t3 = fio_rand64();
    fio_u2str64(data, t0);
    fio_u2str64(data + 8, t1);
    fio_u2str64(data + 16, t2);
    fio_u2str64(data + 24, t3);
    data += 32;
  }
  uint64_t tmp;
  /* 64 bit steps  */
  switch (len & 24) {
  case 24:
    tmp = fio_rand64();
    fio_u2str64(data + 16, tmp);
    /* fallthrough */
  case 16:
    tmp = fio_rand64();
    fio_u2str64(data + 8, tmp);
    /* fallthrough */
  case 8:
    tmp = fio_rand64();
    fio_u2str64(data, tmp);
    data += len & 24;
  }
  if ((len & 7)) {
    tmp = fio_rand64();
    /* leftover bytes */
    switch ((len & 7)) {
    case 7:
      data[6] = (tmp >> 8) & 0xFF;
      /* fallthrough */
    case 6:
      data[5] = (tmp >> 16) & 0xFF;
      /* fallthrough */
    case 5:
      data[4] = (tmp >> 24) & 0xFF;
      /* fallthrough */
    case 4:
      data[3] = (tmp >> 32) & 0xFF;
      /* fallthrough */
    case 3:
      data[2] = (tmp >> 40) & 0xFF;
      /* fallthrough */
    case 2:
      data[1] = (tmp >> 48) & 0xFF;
      /* fallthrough */
    case 1:
      data[0] = (tmp >> 56) & 0xFF;
    }
  }
}